

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpcodeInfo.cpp
# Opt level: O0

OpcodeInfo * __thiscall OpcodeInfo::dst(OpcodeInfo *this,FieldType field,DecodeType decode)

{
  OpcodeInfo *in_RDI;
  DecodeStep new_step;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  DecodeStep::DecodeStep((DecodeStep *)&stack0xffffffffffffffe4);
  step((OpcodeInfo *)
       (CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0) & 0xffffff00ffffffff),
       (DecodeStep *)in_RDI);
  return in_RDI;
}

Assistant:

OpcodeInfo& OpcodeInfo::dst(FieldType field, DecodeType decode) {
  DecodeStep new_step;
  new_step.is_src = false;
  new_step.field = field;
  new_step.decode = decode;
  step(new_step);
  return *this;
}